

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inffast.c
# Opt level: O2

void inflate_fast(z_streamp strm,uint start)

{
  byte *pbVar1;
  byte *pbVar2;
  Bytef *pBVar3;
  byte bVar4;
  byte bVar5;
  ushort uVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  internal_state *piVar10;
  Posf *pPVar11;
  Posf *pPVar12;
  uInt uVar13;
  uInt uVar14;
  uint uVar15;
  uint uVar16;
  Bytef *pBVar17;
  undefined4 uVar18;
  long lVar19;
  char *pcVar20;
  uint uVar21;
  ulong uVar22;
  Bytef *pBVar23;
  long lVar24;
  ulong uVar25;
  ulong uVar26;
  int iVar27;
  Bytef *pBVar28;
  long lVar29;
  Bytef *pBVar30;
  ulong uVar31;
  uint uVar32;
  uint uVar33;
  int local_48;
  
  piVar10 = strm->state;
  pBVar30 = strm->next_in + ((ulong)(strm->avail_in - 5) - 1);
  pBVar23 = strm->next_in + -1;
  pBVar28 = strm->next_out + -1;
  local_48 = (int)pBVar28 - (start - strm->avail_out);
  pBVar17 = strm->next_out + ((ulong)(strm->avail_out - 0x101) - 1);
  iVar7 = *(int *)((long)&piVar10->gzhead + 4);
  uVar8 = piVar10->gzindex;
  uVar9 = *(uint *)&piVar10->method;
  lVar24 = *(long *)&piVar10->last_flush;
  uVar13 = piVar10->ins_h;
  uVar26._0_4_ = piVar10->w_bits;
  uVar26._4_4_ = piVar10->w_mask;
  uVar14 = piVar10->hash_size;
  uVar15 = *(uint *)&piVar10->window;
  pPVar11 = piVar10->prev;
  pPVar12 = piVar10->head;
LAB_0014ba38:
  if (uVar15 < 0xf) {
    pbVar1 = pBVar23 + 1;
    pbVar2 = pBVar23 + 2;
    pBVar23 = pBVar23 + 2;
    uVar26 = ((ulong)*pbVar2 << ((byte)uVar15 + 8 & 0x3f)) +
             ((ulong)*pbVar1 << ((byte)uVar15 & 0x3f)) + uVar26;
    uVar15 = uVar15 | 0x10;
  }
  uVar25 = (ulong)((uint)uVar26 & ~(-1 << ((byte)uVar13 & 0x1f)));
  while( true ) {
    bVar4 = *(byte *)((long)pPVar11 + uVar25 * 4 + 1);
    uVar26 = uVar26 >> (bVar4 & 0x3f);
    bVar5 = (byte)pPVar11[uVar25 * 2];
    uVar15 = uVar15 - bVar4;
    uVar6 = pPVar11[uVar25 * 2 + 1];
    uVar25 = (ulong)uVar6;
    if (bVar5 == 0) break;
    if ((bVar5 & 0x10) != 0) {
      uVar21 = bVar5 & 0xf;
      if ((bVar5 & 0xf) != 0) {
        if (uVar15 < uVar21) {
          pbVar1 = pBVar23 + 1;
          pBVar23 = pBVar23 + 1;
          uVar26 = uVar26 + ((ulong)*pbVar1 << ((byte)uVar15 & 0x3f));
          uVar15 = uVar15 + 8;
        }
        uVar16 = (uint)uVar26;
        uVar26 = uVar26 >> (sbyte)uVar21;
        uVar15 = uVar15 - uVar21;
        uVar25 = (ulong)((~(-1 << (sbyte)uVar21) & uVar16) + (uint)uVar6);
      }
      if (uVar15 < 0xf) {
        pbVar1 = pBVar23 + 1;
        pbVar2 = pBVar23 + 2;
        pBVar23 = pBVar23 + 2;
        uVar26 = ((ulong)*pbVar2 << ((byte)uVar15 + 8 & 0x3f)) +
                 ((ulong)*pbVar1 << ((byte)uVar15 & 0x3f)) + uVar26;
        uVar15 = uVar15 | 0x10;
      }
      uVar31 = (ulong)((uint)uVar26 & ~(-1 << ((byte)uVar14 & 0x1f)));
      goto LAB_0014bb1c;
    }
    if ((bVar5 & 0x40) != 0) {
      if ((bVar5 & 0x20) != 0) {
        uVar18 = 0xb;
        goto LAB_0014be2f;
      }
      pcVar20 = "invalid literal/length code";
      goto LAB_0014be1f;
    }
    uVar25 = (~(-1 << (bVar5 & 0x1f)) & (uint)uVar26) + uVar25;
  }
  pBVar28[1] = (Bytef)uVar6;
  pBVar28 = pBVar28 + 1;
  goto LAB_0014bdcc;
LAB_0014bb1c:
  bVar4 = *(byte *)((long)pPVar12 + uVar31 * 4 + 1);
  uVar26 = uVar26 >> (bVar4 & 0x3f);
  bVar5 = (byte)pPVar12[uVar31 * 2];
  uVar15 = uVar15 - bVar4;
  if ((bVar5 & 0x10) != 0) goto LAB_0014bb57;
  if ((bVar5 & 0x40) != 0) {
    pcVar20 = "invalid distance code";
    goto LAB_0014be1f;
  }
  uVar31 = (ulong)(~(-1 << (bVar5 & 0x1f)) & (uint)uVar26) + (ulong)pPVar12[uVar31 * 2 + 1];
  goto LAB_0014bb1c;
LAB_0014bb57:
  uVar21 = bVar5 & 0xf;
  if (uVar15 < uVar21) {
    uVar26 = ((ulong)pBVar23[1] << ((byte)uVar15 & 0x3f)) + uVar26;
    uVar16 = uVar15 + 8;
    if (uVar16 < uVar21) {
      pbVar1 = pBVar23 + 2;
      pBVar23 = pBVar23 + 2;
      uVar26 = uVar26 + ((ulong)*pbVar1 << ((byte)uVar16 & 0x3f));
      uVar15 = uVar15 + 0x10;
    }
    else {
      pBVar23 = pBVar23 + 1;
      uVar15 = uVar16;
    }
  }
  uVar32 = (~(-1 << (sbyte)uVar21) & (uint)uVar26) + (uint)pPVar12[uVar31 * 2 + 1];
  uVar26 = uVar26 >> (sbyte)uVar21;
  uVar15 = uVar15 - uVar21;
  uVar21 = (int)pBVar28 - local_48;
  uVar31 = (ulong)uVar32;
  uVar33 = uVar32 - uVar21;
  uVar16 = (uint)uVar25;
  if (uVar32 < uVar21 || uVar33 == 0) {
    lVar29 = 0;
    do {
      lVar19 = lVar29;
      pBVar28[lVar19 + 1] = pBVar28[lVar19 + (1 - uVar31)];
      pBVar28[lVar19 + 2] = pBVar28[lVar19 + (2 - uVar31)];
      pBVar28[lVar19 + 3] = pBVar28[lVar19 + (3 - uVar31)];
      uVar21 = (int)uVar25 - 3;
      uVar25 = (ulong)uVar21;
      lVar29 = lVar19 + 3;
    } while (2 < uVar21);
    if ((uint)lVar29 == uVar16) {
      pBVar28 = pBVar28 + lVar29;
    }
    else {
      pBVar28[lVar19 + 4] = pBVar28[-uVar31 + 1 + lVar29];
      if ((uint)lVar29 - uVar16 == -2) {
        pBVar3 = pBVar28 + -uVar31 + 2 + lVar29;
        pBVar28 = pBVar28 + lVar19 + 5;
        *pBVar28 = *pBVar3;
      }
      else {
        pBVar28 = pBVar28 + lVar19 + 4;
      }
    }
    goto LAB_0014bdcc;
  }
  if (uVar8 < uVar33) {
    pcVar20 = "invalid distance too far back";
LAB_0014be1f:
    strm->msg = pcVar20;
    uVar18 = 0x1b;
LAB_0014be2f:
    *(undefined4 *)&piVar10->strm = uVar18;
LAB_0014be32:
    lVar24 = (long)pBVar23 - (ulong)(uVar15 >> 3);
    strm->next_in = (Bytef *)(lVar24 + 1);
    strm->next_out = pBVar28 + 1;
    strm->avail_in = ((int)pBVar30 - (int)lVar24) + 5;
    uVar26 = (ulong)((uint)uVar26 & ~(-1 << (sbyte)(uVar15 & 7)));
    strm->avail_out = ((int)pBVar17 - (int)pBVar28) + 0x101;
    piVar10->w_bits = (int)uVar26;
    piVar10->w_mask = (int)(uVar26 >> 0x20);
    *(uint *)&piVar10->window = uVar15 & 7;
    return;
  }
  if (uVar9 == 0) {
    uVar22 = (ulong)(iVar7 - uVar33);
    uVar21 = uVar16 - uVar33;
    if (uVar16 < uVar33 || uVar21 == 0) goto LAB_0014bd4b;
    lVar29 = 0;
    do {
      pBVar28[1] = *(Bytef *)(uVar22 + lVar24 + lVar29);
      pBVar28 = pBVar28 + 1;
      lVar29 = lVar29 + 1;
    } while (uVar33 != (uint)lVar29);
LAB_0014bd40:
    lVar29 = (long)pBVar28 - uVar31;
    uVar25 = (ulong)uVar21;
  }
  else {
    if (uVar9 < uVar33) {
      uVar22 = (ulong)((uVar9 + iVar7) - uVar33);
      uVar33 = uVar33 - uVar9;
      uVar21 = uVar16 - uVar33;
      if (uVar33 <= uVar16 && uVar21 != 0) {
        lVar29 = 0;
        do {
          pBVar28[lVar29 + 1] = *(Bytef *)(uVar22 + lVar24 + lVar29);
          lVar29 = lVar29 + 1;
        } while (uVar33 != (uint)lVar29);
        pBVar28 = pBVar28 + lVar29;
        if (uVar9 < uVar21) {
          lVar29 = 0;
          do {
            pBVar28[1] = *(Bytef *)(lVar24 + lVar29);
            pBVar28 = pBVar28 + 1;
            lVar29 = lVar29 + 1;
          } while (uVar9 != (uint)lVar29);
          uVar25 = (ulong)(uVar21 - uVar9);
          lVar29 = (long)pBVar28 - uVar31;
        }
        else {
          uVar25 = (ulong)uVar21;
          lVar29 = lVar24 + -1;
        }
        goto LAB_0014bd55;
      }
    }
    else {
      uVar22 = (ulong)(uVar9 - uVar33);
      uVar21 = uVar16 - uVar33;
      if (uVar33 <= uVar16 && uVar21 != 0) {
        lVar29 = 0;
        do {
          pBVar28[1] = *(Bytef *)(uVar22 + lVar24 + lVar29);
          pBVar28 = pBVar28 + 1;
          lVar29 = lVar29 + 1;
        } while (uVar33 != (uint)lVar29);
        goto LAB_0014bd40;
      }
    }
LAB_0014bd4b:
    lVar29 = uVar22 + lVar24 + -1;
  }
LAB_0014bd55:
  lVar19 = 0;
  iVar27 = (int)uVar25;
  for (; 2 < (uint)uVar25; uVar25 = (ulong)((uint)uVar25 - 3)) {
    pBVar28[lVar19 + 1] = *(Bytef *)(lVar29 + 1 + lVar19);
    pBVar28[lVar19 + 2] = *(Bytef *)(lVar29 + 2 + lVar19);
    pBVar28[lVar19 + 3] = *(Bytef *)(lVar29 + 3 + lVar19);
    lVar19 = lVar19 + 3;
  }
  if ((int)lVar19 == iVar27) {
    pBVar28 = pBVar28 + lVar19;
  }
  else {
    pBVar28[lVar19 + 1] = *(Bytef *)(lVar29 + 1 + lVar19);
    if ((int)lVar19 - iVar27 == -2) {
      pBVar28 = pBVar28 + lVar19 + 2;
      *pBVar28 = *(Bytef *)(lVar29 + 2 + lVar19);
    }
    else {
      pBVar28 = pBVar28 + lVar19 + 1;
    }
  }
LAB_0014bdcc:
  if ((pBVar30 <= pBVar23) || (pBVar17 <= pBVar28)) goto LAB_0014be32;
  goto LAB_0014ba38;
}

Assistant:

void inflate_fast(strm, start)
z_streamp strm;
unsigned start;         /* inflate()'s starting value for strm->avail_out */
{
    struct inflate_state FAR *state;
    unsigned char FAR *in;      /* local strm->next_in */
    unsigned char FAR *last;    /* while in < last, enough input available */
    unsigned char FAR *out;     /* local strm->next_out */
    unsigned char FAR *beg;     /* inflate()'s initial strm->next_out */
    unsigned char FAR *end;     /* while out < end, enough space available */
#ifdef INFLATE_STRICT
    unsigned dmax;              /* maximum distance from zlib header */
#endif
    unsigned wsize;             /* window size or zero if not using window */
    unsigned whave;             /* valid bytes in the window */
    unsigned write;             /* window write index */
    unsigned char FAR *window;  /* allocated sliding window, if wsize != 0 */
    unsigned long hold;         /* local strm->hold */
    unsigned bits;              /* local strm->bits */
    code const FAR *lcode;      /* local strm->lencode */
    code const FAR *dcode;      /* local strm->distcode */
    unsigned lmask;             /* mask for first level of length codes */
    unsigned dmask;             /* mask for first level of distance codes */
    code this;                  /* retrieved table entry */
    unsigned op;                /* code bits, operation, extra bits, or */
                                /*  window position, window bytes to copy */
    unsigned len;               /* match length, unused bytes */
    unsigned dist;              /* match distance */
    unsigned char FAR *from;    /* where to copy match from */

    /* copy state to local variables */
    state = (struct inflate_state FAR *)strm->state;
    in = strm->next_in - OFF;
    last = in + (strm->avail_in - 5);
    out = strm->next_out - OFF;
    beg = out - (start - strm->avail_out);
    end = out + (strm->avail_out - 257);
#ifdef INFLATE_STRICT
    dmax = state->dmax;
#endif
    wsize = state->wsize;
    whave = state->whave;
    write = state->write;
    window = state->window;
    hold = state->hold;
    bits = state->bits;
    lcode = state->lencode;
    dcode = state->distcode;
    lmask = (1U << state->lenbits) - 1;
    dmask = (1U << state->distbits) - 1;

    /* decode literals and length/distances until end-of-block or not enough
       input data or output space */
    do {
        if (bits < 15) {
            hold += (unsigned long)(PUP(in)) << bits;
            bits += 8;
            hold += (unsigned long)(PUP(in)) << bits;
            bits += 8;
        }
        this = lcode[hold & lmask];
      dolen:
        op = (unsigned)(this.bits);
        hold >>= op;
        bits -= op;
        op = (unsigned)(this.op);
        if (op == 0) {                          /* literal */
            Tracevv((stderr, this.val >= 0x20 && this.val < 0x7f ?
                    "inflate:         literal '%c'\n" :
                    "inflate:         literal 0x%02x\n", this.val));
            PUP(out) = (unsigned char)(this.val);
        }
        else if (op & 16) {                     /* length base */
            len = (unsigned)(this.val);
            op &= 15;                           /* number of extra bits */
            if (op) {
                if (bits < op) {
                    hold += (unsigned long)(PUP(in)) << bits;
                    bits += 8;
                }
                len += (unsigned)hold & ((1U << op) - 1);
                hold >>= op;
                bits -= op;
            }
            Tracevv((stderr, "inflate:         length %u\n", len));
            if (bits < 15) {
                hold += (unsigned long)(PUP(in)) << bits;
                bits += 8;
                hold += (unsigned long)(PUP(in)) << bits;
                bits += 8;
            }
            this = dcode[hold & dmask];
          dodist:
            op = (unsigned)(this.bits);
            hold >>= op;
            bits -= op;
            op = (unsigned)(this.op);
            if (op & 16) {                      /* distance base */
                dist = (unsigned)(this.val);
                op &= 15;                       /* number of extra bits */
                if (bits < op) {
                    hold += (unsigned long)(PUP(in)) << bits;
                    bits += 8;
                    if (bits < op) {
                        hold += (unsigned long)(PUP(in)) << bits;
                        bits += 8;
                    }
                }
                dist += (unsigned)hold & ((1U << op) - 1);
#ifdef INFLATE_STRICT
                if (dist > dmax) {
                    strm->msg = (char *)"invalid distance too far back";
                    state->mode = BAD;
                    break;
                }
#endif
                hold >>= op;
                bits -= op;
                Tracevv((stderr, "inflate:         distance %u\n", dist));
                op = (unsigned)(out - beg);     /* max distance in output */
                if (dist > op) {                /* see if copy from window */
                    op = dist - op;             /* distance back in window */
                    if (op > whave) {
                        strm->msg = (char *)"invalid distance too far back";
                        state->mode = BAD;
                        break;
                    }
                    from = window - OFF;
                    if (write == 0) {           /* very common case */
                        from += wsize - op;
                        if (op < len) {         /* some from window */
                            len -= op;
                            do {
                                PUP(out) = PUP(from);
                            } while (--op);
                            from = out - dist;  /* rest from output */
                        }
                    }
                    else if (write < op) {      /* wrap around window */
                        from += wsize + write - op;
                        op -= write;
                        if (op < len) {         /* some from end of window */
                            len -= op;
                            do {
                                PUP(out) = PUP(from);
                            } while (--op);
                            from = window - OFF;
                            if (write < len) {  /* some from start of window */
                                op = write;
                                len -= op;
                                do {
                                    PUP(out) = PUP(from);
                                } while (--op);
                                from = out - dist;      /* rest from output */
                            }
                        }
                    }
                    else {                      /* contiguous in window */
                        from += write - op;
                        if (op < len) {         /* some from window */
                            len -= op;
                            do {
                                PUP(out) = PUP(from);
                            } while (--op);
                            from = out - dist;  /* rest from output */
                        }
                    }
                    while (len > 2) {
                        PUP(out) = PUP(from);
                        PUP(out) = PUP(from);
                        PUP(out) = PUP(from);
                        len -= 3;
                    }
                    if (len) {
                        PUP(out) = PUP(from);
                        if (len > 1)
                            PUP(out) = PUP(from);
                    }
                }
                else {
                    from = out - dist;          /* copy direct from output */
                    do {                        /* minimum length is three */
                        PUP(out) = PUP(from);
                        PUP(out) = PUP(from);
                        PUP(out) = PUP(from);
                        len -= 3;
                    } while (len > 2);
                    if (len) {
                        PUP(out) = PUP(from);
                        if (len > 1)
                            PUP(out) = PUP(from);
                    }
                }
            }
            else if ((op & 64) == 0) {          /* 2nd level distance code */
                this = dcode[this.val + (hold & ((1U << op) - 1))];
                goto dodist;
            }
            else {
                strm->msg = (char *)"invalid distance code";
                state->mode = BAD;
                break;
            }
        }
        else if ((op & 64) == 0) {              /* 2nd level length code */
            this = lcode[this.val + (hold & ((1U << op) - 1))];
            goto dolen;
        }
        else if (op & 32) {                     /* end-of-block */
            Tracevv((stderr, "inflate:         end of block\n"));
            state->mode = TYPE;
            break;
        }
        else {
            strm->msg = (char *)"invalid literal/length code";
            state->mode = BAD;
            break;
        }
    } while (in < last && out < end);

    /* return unused bytes (on entry, bits < 8, so in won't go too far back) */
    len = bits >> 3;
    in -= len;
    bits -= len << 3;
    hold &= (1U << bits) - 1;

    /* update state and return */
    strm->next_in = in + OFF;
    strm->next_out = out + OFF;
    strm->avail_in = (unsigned)(in < last ? 5 + (last - in) : 5 - (in - last));
    strm->avail_out = (unsigned)(out < end ?
                                 257 + (end - out) : 257 - (out - end));
    state->hold = hold;
    state->bits = bits;
    return;
}